

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::NewPoWValidBlock
          (PeerManagerImpl *this,CBlockIndex *pindex,shared_ptr<const_CBlock> *pblock)

{
  bool bVar1;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>,_bool>
  pVar2;
  shared_ptr<const_CTransaction> *tx;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  __single_object most_recent_block_txs;
  shared_future<CSerializedNetMsg> lazy_ser;
  shared_ptr<const_CBlockHeaderAndShortTxIDs> pcmpctblock;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock43;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock42;
  uint256 hashBlock;
  undefined6 in_stack_fffffffffffffdc8;
  BuriedDeployment in_stack_fffffffffffffdce;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  CBlockIndex *in_stack_fffffffffffffdd8;
  unique_ptr<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
  *this_00;
  FastRandomContext *in_stack_fffffffffffffde0;
  CBlockHeader *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  _Rb_tree_iterator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>
  in_stack_fffffffffffffdf8;
  NodeFn *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  undefined8 in_stack_fffffffffffffe10;
  launch __policy;
  unique_ptr<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
  local_138;
  undefined1 *local_130;
  uint64_t local_108;
  undefined1 local_100 [32];
  _Base_ptr local_e0;
  undefined1 local_d8;
  _Base_ptr local_d0;
  undefined1 local_c8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  long local_8;
  
  __policy = (launch)((ulong)in_stack_fffffffffffffe10 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffdd8);
  FastRandomContext::FastRandomContext
            ((FastRandomContext *)in_stack_fffffffffffffdd8,(bool)in_stack_fffffffffffffdd7);
  local_108 = FastRandomContext::rand64(in_stack_fffffffffffffde0);
  std::make_shared<CBlockHeaderAndShortTxIDs_const,CBlock_const&,unsigned_long>
            ((CBlock *)in_stack_fffffffffffffdf8._M_node,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
  FastRandomContext::~FastRandomContext
            ((FastRandomContext *)CONCAT26(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT26(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe00,
             (char *)in_stack_fffffffffffffdf8._M_node,
             (char *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
             (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffde8 >> 0x18,0));
  if (*(int *)(in_RDI + 0x404) < *(int *)(in_RSI + 0x18)) {
    *(undefined4 *)(in_RDI + 0x404) = *(undefined4 *)(in_RSI + 0x18);
    bVar1 = DeploymentActiveAt<Consensus::BuriedDeployment>
                      (in_stack_fffffffffffffdd8,
                       (ChainstateManager *)
                       CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                       in_stack_fffffffffffffdce);
    if (bVar1) {
      std::__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 CONCAT26(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8));
      CBlockHeader::GetHash(in_stack_fffffffffffffde8);
      local_130 = local_100;
      std::
      async<(anonymous_namespace)::PeerManagerImpl::NewPoWValidBlock(CBlockIndex_const*,std::shared_ptr<CBlock_const>const&)::__1>
                (__policy,(type *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
      std::shared_future<CSerializedNetMsg>::shared_future
                ((shared_future<CSerializedNetMsg> *)
                 CONCAT26(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8),
                 (future<CSerializedNetMsg> *)0x2991c7);
      std::future<CSerializedNetMsg>::~future
                ((future<CSerializedNetMsg> *)
                 CONCAT26(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8));
      std::
      make_unique<std::map<uint256,std::shared_ptr<CTransaction_const>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>>>
                ();
      std::__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 CONCAT26(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8));
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
      while (bVar1 = __gnu_cxx::
                     operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                               ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                 *)in_stack_fffffffffffffdd8,
                                (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0)),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
        ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                     *)CONCAT26(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8));
        in_stack_fffffffffffffe00 =
             (NodeFn *)
             std::
             unique_ptr<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
             ::operator->((unique_ptr<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                           *)CONCAT26(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8));
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT26(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8));
        CTransaction::GetHash
                  ((CTransaction *)CONCAT26(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8));
        pVar2 = std::
                map<uint256,std::shared_ptr<CTransaction_const>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>>
                ::
                emplace<transaction_identifier<false>const&,std::shared_ptr<CTransaction_const>const&>
                          ((map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>
                            *)in_stack_fffffffffffffde8,
                           (transaction_identifier<false> *)in_stack_fffffffffffffde0,
                           (shared_ptr<const_CTransaction> *)in_stack_fffffffffffffdd8);
        local_d0 = (_Base_ptr)pVar2.first._M_node;
        in_stack_fffffffffffffe0f = pVar2.second;
        local_c8 = in_stack_fffffffffffffe0f;
        in_stack_fffffffffffffde8 =
             (CBlockHeader *)
             std::
             unique_ptr<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
             ::operator->((unique_ptr<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                           *)CONCAT26(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8));
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT26(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8));
        CTransaction::GetWitnessHash
                  ((CTransaction *)CONCAT26(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8));
        pVar2 = std::
                map<uint256,std::shared_ptr<CTransaction_const>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>>
                ::
                emplace<transaction_identifier<true>const&,std::shared_ptr<CTransaction_const>const&>
                          ((map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>
                            *)in_stack_fffffffffffffde8,
                           (transaction_identifier<true> *)in_stack_fffffffffffffde0,
                           (shared_ptr<const_CTransaction> *)in_stack_fffffffffffffdd8);
        in_stack_fffffffffffffdf8 = pVar2.first._M_node;
        in_stack_fffffffffffffdf7 = pVar2.second;
        local_e0 = in_stack_fffffffffffffdf8._M_node;
        local_d8 = in_stack_fffffffffffffdf7;
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
        ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                      *)CONCAT26(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8));
      }
      MaybeCheckNotHeld((Mutex *)CONCAT26(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8));
      UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
                 CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                 (AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffe00,
                 (char *)in_stack_fffffffffffffdf8._M_node,
                 (char *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                 (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffde8 >> 0x18,0));
      *(undefined8 *)(in_RDI + 0x388) = local_a0;
      *(undefined8 *)(in_RDI + 0x390) = uStack_98;
      *(undefined8 *)(in_RDI + 0x378) = local_b0;
      *(undefined8 *)(in_RDI + 0x380) = uStack_a8;
      std::shared_ptr<const_CBlock>::operator=
                ((shared_ptr<const_CBlock> *)in_stack_fffffffffffffdd8,
                 (shared_ptr<const_CBlock> *)
                 CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
      std::shared_ptr<const_CBlockHeaderAndShortTxIDs>::operator=
                ((shared_ptr<const_CBlockHeaderAndShortTxIDs> *)in_stack_fffffffffffffdd8,
                 (shared_ptr<const_CBlockHeaderAndShortTxIDs> *)
                 CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
      this_00 = &local_138;
      std::
      unique_ptr<std::map<uint256,std::shared_ptr<CTransaction_const>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>>const,std::default_delete<std::map<uint256,std::shared_ptr<CTransaction_const>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>>const>>
      ::operator=((unique_ptr<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                  (unique_ptr<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                   *)CONCAT26(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8));
      UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
                 CONCAT26(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8));
      std::
      unique_ptr<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
      ::~unique_ptr(this_00);
      std::function<void(CNode*)>::
      function<(anonymous_namespace)::PeerManagerImpl::NewPoWValidBlock(CBlockIndex_const*,std::shared_ptr<CBlock_const>const&)::__0,void>
                ((function<void_(CNode_*)> *)in_stack_fffffffffffffde8,
                 *(anon_class_32_4_8925128f **)(in_RDI + 0x100));
      CConnman::ForEachNode
                ((CConnman *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                 in_stack_fffffffffffffe00);
      std::function<void_(CNode_*)>::~function
                ((function<void_(CNode_*)> *)
                 CONCAT26(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8));
      std::shared_future<CSerializedNetMsg>::~shared_future
                ((shared_future<CSerializedNetMsg> *)
                 CONCAT26(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8));
    }
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT26(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8));
  std::shared_ptr<const_CBlockHeaderAndShortTxIDs>::~shared_ptr
            ((shared_ptr<const_CBlockHeaderAndShortTxIDs> *)
             CONCAT26(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::NewPoWValidBlock(const CBlockIndex *pindex, const std::shared_ptr<const CBlock>& pblock)
{
    auto pcmpctblock = std::make_shared<const CBlockHeaderAndShortTxIDs>(*pblock, FastRandomContext().rand64());

    LOCK(cs_main);

    if (pindex->nHeight <= m_highest_fast_announce)
        return;
    m_highest_fast_announce = pindex->nHeight;

    if (!DeploymentActiveAt(*pindex, m_chainman, Consensus::DEPLOYMENT_SEGWIT)) return;

    uint256 hashBlock(pblock->GetHash());
    const std::shared_future<CSerializedNetMsg> lazy_ser{
        std::async(std::launch::deferred, [&] { return NetMsg::Make(NetMsgType::CMPCTBLOCK, *pcmpctblock); })};

    {
        auto most_recent_block_txs = std::make_unique<std::map<uint256, CTransactionRef>>();
        for (const auto& tx : pblock->vtx) {
            most_recent_block_txs->emplace(tx->GetHash(), tx);
            most_recent_block_txs->emplace(tx->GetWitnessHash(), tx);
        }

        LOCK(m_most_recent_block_mutex);
        m_most_recent_block_hash = hashBlock;
        m_most_recent_block = pblock;
        m_most_recent_compact_block = pcmpctblock;
        m_most_recent_block_txs = std::move(most_recent_block_txs);
    }

    m_connman.ForEachNode([this, pindex, &lazy_ser, &hashBlock](CNode* pnode) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        AssertLockHeld(::cs_main);

        if (pnode->GetCommonVersion() < INVALID_CB_NO_BAN_VERSION || pnode->fDisconnect)
            return;
        ProcessBlockAvailability(pnode->GetId());
        CNodeState &state = *State(pnode->GetId());
        // If the peer has, or we announced to them the previous block already,
        // but we don't think they have this one, go ahead and announce it
        if (state.m_requested_hb_cmpctblocks && !PeerHasHeader(&state, pindex) && PeerHasHeader(&state, pindex->pprev)) {

            LogDebug(BCLog::NET, "%s sending header-and-ids %s to peer=%d\n", "PeerManager::NewPoWValidBlock",
                    hashBlock.ToString(), pnode->GetId());

            const CSerializedNetMsg& ser_cmpctblock{lazy_ser.get()};
            PushMessage(*pnode, ser_cmpctblock.Copy());
            state.pindexBestHeaderSent = pindex;
        }
    });
}